

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::TagSize(int field_number,FieldType type)

{
  size_t result;
  FieldType type_local;
  int field_number_local;
  
  _type_local = io::CodedOutputStream::VarintSize32(field_number << 3);
  if (type == TYPE_GROUP) {
    _type_local = _type_local << 1;
  }
  return _type_local;
}

Assistant:

inline size_t WireFormatLite::TagSize(int field_number,
                                      WireFormatLite::FieldType type) {
  size_t result = io::CodedOutputStream::VarintSize32(
    field_number << kTagTypeBits);
  if (type == TYPE_GROUP) {
    // Groups have both a start and an end tag.
    return result * 2;
  } else {
    return result;
  }
}